

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O1

size_t __thiscall cmInstallExportGenerator::GetMaxConfigLength(cmInstallExportGenerator *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  pointer pbVar2;
  ulong uVar3;
  size_t sVar4;
  const_iterator ci;
  pointer pbVar5;
  
  pvVar1 = (this->super_cmInstallGenerator).super_cmScriptGenerator.ConfigurationTypes;
  pbVar5 = (pvVar1->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (pvVar1->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar5 != pbVar2) {
    uVar3 = 8;
    do {
      if (uVar3 < pbVar5->_M_string_length) {
        uVar3 = pbVar5->_M_string_length;
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != pbVar2);
    return uVar3;
  }
  uVar3 = (this->super_cmInstallGenerator).super_cmScriptGenerator.ConfigurationName.
          _M_string_length;
  sVar4 = 8;
  if (8 < uVar3) {
    sVar4 = uVar3;
  }
  return sVar4;
}

Assistant:

size_t cmInstallExportGenerator::GetMaxConfigLength() const
{
  // Always use at least 8 for "noconfig".
  size_t len = 8;
  if (this->ConfigurationTypes->empty()) {
    if (this->ConfigurationName.size() > 8) {
      len = this->ConfigurationName.size();
    }
  } else {
    for (std::vector<std::string>::const_iterator ci =
           this->ConfigurationTypes->begin();
         ci != this->ConfigurationTypes->end(); ++ci) {
      if (ci->size() > len) {
        len = ci->size();
      }
    }
  }
  return len;
}